

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O2

void __thiscall OpenMD::Molecule::addInversion(Molecule *this,Inversion *inversion)

{
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  _Var1;
  Inversion *local_10;
  
  local_10 = inversion;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::Inversion**,std::vector<OpenMD::Inversion*,std::allocator<OpenMD::Inversion*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::Inversion*const>>
                    ((this->inversions_).
                     super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (this->inversions_).
                     super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->inversions_).
      super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::push_back
              (&this->inversions_,&local_10);
  }
  return;
}

Assistant:

void Molecule::addInversion(Inversion* inversion) {
    if (std::find(inversions_.begin(), inversions_.end(), inversion) ==
        inversions_.end()) {
      inversions_.push_back(inversion);
    }
  }